

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint zlib_decompress(uchar **out,size_t *outsize,size_t expected_size,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  uint uVar1;
  uchar *puVar2;
  ulong __size;
  ucvector v;
  ucvector local_50;
  size_t local_38;
  
  if (settings->custom_zlib !=
      (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0) {
    uVar1 = (*settings->custom_zlib)(out,outsize,in,insize,settings);
    return uVar1;
  }
  local_50.data = *out;
  local_50.size = *outsize;
  local_50.allocsize = local_50.size;
  if (expected_size == 0) goto LAB_00124f2f;
  puVar2 = local_50.data;
  __size = local_50.size;
  if (local_50.size < expected_size + local_50.size) {
    __size = (local_50.size >> 1) + expected_size + local_50.size;
    local_38 = insize;
    puVar2 = (uchar *)realloc(local_50.data,__size);
    insize = local_38;
    if (puVar2 != (uchar *)0x0) goto LAB_00124f22;
  }
  else {
LAB_00124f22:
    local_50.allocsize = __size;
    local_50.data = puVar2;
  }
  local_50.size = *outsize;
LAB_00124f2f:
  uVar1 = lodepng_zlib_decompressv(&local_50,in,insize,settings);
  *out = local_50.data;
  *outsize = local_50.size;
  return uVar1;
}

Assistant:

static unsigned zlib_decompress(unsigned char** out, size_t* outsize, size_t expected_size,
                                const unsigned char* in, size_t insize, const LodePNGDecompressSettings* settings) {
  if(settings->custom_zlib) {
    return settings->custom_zlib(out, outsize, in, insize, settings);
  } else {
    unsigned error;
    ucvector v = ucvector_init(*out, *outsize);
    if(expected_size) {
      /*reserve the memory to avoid intermediate reallocations*/
      ucvector_resize(&v, *outsize + expected_size);
      v.size = *outsize;
    }
    error = lodepng_zlib_decompressv(&v, in, insize, settings);
    *out = v.data;
    *outsize = v.size;
    return error;
  }
}